

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_InitUndeclConsoleLetProperty<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  FrameDisplay *this_00;
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  RecyclableObject *instance;
  undefined4 *puVar3;
  void *obj;
  
  this_00 = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  instance = (RecyclableObject *)FrameDisplay::GetItem(this_00,this_00->length - 1);
  bVar2 = VarIsImpl<Js::ConsoleScopeActivationObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1400,
                                "(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)))"
                                ,"How come we got this opcode without ConsoleScopeActivationObject?"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  obj = FrameDisplay::GetItem(this_00,0);
  JavascriptOperators::OP_InitLetProperty
            (obj,propertyId,*(Var *)(*(long *)(*(long *)(this + 0x78) + 8) + 0x4f8));
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitUndeclConsoleLetProperty(unaligned T* playout)
    {
        FrameDisplay* pScope = (FrameDisplay*)this->LdEnv();
        AssertMsg(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)), "How come we got this opcode without ConsoleScopeActivationObject?");
        PropertyId propertyId = m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex);
        JavascriptOperators::OP_InitLetProperty(pScope->GetItem(0), propertyId, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }